

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int user_confirm(tgestate_t *state)

{
  uint uVar1;
  byte bVar2;
  undefined1 uVar3;
  screenlocstring_t *in_RDI;
  tgestate_t *unaff_retaddr;
  int flags;
  uint8_t keymask;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff4;
  undefined4 uVar4;
  
  screenlocstring_plot(unaff_retaddr,in_RDI);
  while( true ) {
    bVar2 = (**(code **)in_RDI[1].string)(in_RDI[1].string,0xdffe);
    uVar4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffff4);
    if ((bVar2 & 0x10) == 0) {
      return 0;
    }
    uVar3 = (**(code **)in_RDI[1].string)(in_RDI[1].string,0x7ffe);
    uVar1 = CONCAT13(uVar3,(int3)uVar4);
    in_stack_fffffffffffffff4 = uVar1 ^ 0xff000000;
    if ((in_stack_fffffffffffffff4 & 0x8000000) != 0) break;
    gamedelay((tgestate_t *)(CONCAT44(uVar1,in_stack_fffffffffffffff0) ^ 0xff00000000000000),
              in_stack_ffffffffffffffec);
  }
  return 1;
}

Assistant:

int user_confirm(tgestate_t *state)
{
  /** $F014 */
  static const screenlocstring_t screenlocstring_confirm_y_or_n =
  {
    0x100B, 15, "CONFIRM. Y OR N"
  };

  uint8_t keymask; /* was A */
  int     flags;   /* Conv: added */

  assert(state != NULL);

  screenlocstring_plot(state, &screenlocstring_confirm_y_or_n);

  /* Keyscan. */
  for (;;)
  {
    keymask = state->speccy->in(state->speccy, port_KEYBOARD_POIUY);
    if ((keymask & (1 << 4)) == 0)
    {
      flags = 0; /* is 'Y' pressed? return Z */
      goto exit;
    }

    keymask = state->speccy->in(state->speccy, port_KEYBOARD_SPACESYMSHFTMNB);
    keymask = ~keymask;
    if ((keymask & (1 << 3)) != 0)
    {
      flags = 1; /* is 'N' pressed? return NZ */
      goto exit;
    }

    /* Conv: Timing: The original game keyscans as fast as it can. We can't
     * have that so instead we introduce a short delay and handle game thread
     * termination. */
    gamedelay(state, 3500000 / 50); /* 50/sec */
  }

exit:
  return flags;
}